

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O0

void __thiscall deqp::egl::MakeCurrentPerfCase::~MakeCurrentPerfCase(MakeCurrentPerfCase *this)

{
  MakeCurrentPerfCase *this_local;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MakeCurrentPerfCase_006718a8;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_samples);
  std::vector<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>::~vector
            (&this->m_pixmaps);
  std::vector<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>::~vector
            (&this->m_windows);
  std::vector<void_*,_std::allocator<void_*>_>::~vector(&this->m_surfaces);
  std::vector<void_*,_std::allocator<void_*>_>::~vector(&this->m_contexts);
  de::Random::~Random(&this->m_rnd);
  TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

MakeCurrentPerfCase::~MakeCurrentPerfCase (void)
{
	deinit();
}